

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_31871::relu_test_backp_Test::~relu_test_backp_Test(relu_test_backp_Test *this)

{
  relu_test_backp_Test *this_local;
  
  ~relu_test_backp_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(relu_test, backp)
    {
        _relu0->forwardp(*_test_data);
        auto b = _relu0->backp(*_test_data2);
        auto inp = b.input;
        EXPECT_FLOAT_EQ((inp[{0, 0}]), 0);
        EXPECT_FLOAT_EQ((inp[{0, 1}]), 0);
        EXPECT_FLOAT_EQ((inp[{1, 0}]), 10);
    }